

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>
::dx(FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>
     *this,int i)

{
  double dVar1;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar2;
  Fad<double> *pFVar3;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar4;
  Fad<double> *pFVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  
  pFVar2 = (this->left_->fadexpr_).right_;
  pFVar3 = (pFVar2->fadexpr_).right_;
  pdVar7 = &pFVar3->defaultVal;
  if ((pFVar3->dx_).num_elts != 0) {
    pdVar7 = (pFVar3->dx_).ptr_to_data + i;
  }
  pFVar4 = (this->right_->fadexpr_).left_;
  pFVar3 = (pFVar4->fadexpr_).right_;
  pdVar8 = &pFVar3->defaultVal;
  if ((pFVar3->dx_).num_elts != 0) {
    pdVar8 = (pFVar3->dx_).ptr_to_data + i;
  }
  pFVar5 = (this->right_->fadexpr_).right_;
  dVar1 = (pFVar4->fadexpr_).left_.constant_;
  pdVar6 = &pFVar5->defaultVal;
  if ((pFVar5->dx_).num_elts != 0) {
    pdVar6 = (pFVar5->dx_).ptr_to_data + i;
  }
  return (*pdVar8 * dVar1 * pFVar5->val_ + dVar1 * pFVar3->val_ * *pdVar6) -
         *pdVar7 * (pFVar2->fadexpr_).left_.constant_;
}

Assistant:

const value_type dx(int i) const {return left_.dx(i) + right_.dx(i);}